

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O0

void clone_setn(t_clone *x,t_floatarg f)

{
  int iVar1;
  int oldstate;
  int iVar2;
  _glist *p_Var3;
  t_copy *ptVar4;
  t_out **pptVar5;
  t_out *ptVar6;
  t_out *outvec;
  _glist *c;
  int j;
  int i;
  int wantn;
  int nwas;
  int dspstate;
  t_floatarg f_local;
  t_clone *x_local;
  
  oldstate = canvas_suspend_dsp();
  iVar1 = x->x_n;
  j = (int)f;
  if (j < 1) {
    pd_error(x,"can\'t resize to zero or negative number; setting to 1");
    j = 1;
  }
  c._4_4_ = iVar1;
  if (iVar1 < j) {
    for (; c._4_4_ < j; c._4_4_ = c._4_4_ + 1) {
      x->x_argv->a_type = A_FLOAT;
      (x->x_argv->a_w).w_float = (float)(x->x_startvoice + c._4_4_);
      p_Var3 = clone_makeone(x->x_s,x->x_argc - x->x_suppressvoice,x->x_argv + x->x_suppressvoice);
      if (p_Var3 == (_glist *)0x0) {
        pd_error(x,"clone: couldn\'t create \'%s\'",x->x_s->s_name);
        goto LAB_00155514;
      }
      ptVar4 = (t_copy *)resizebytes(x->x_vec,(long)c._4_4_ << 4,(long)(c._4_4_ + 1) << 4);
      x->x_vec = ptVar4;
      x->x_vec[c._4_4_].c_gl = p_Var3;
      x->x_vec[c._4_4_].c_on = 0;
      pptVar5 = (t_out **)resizebytes(x->x_outvec,(long)c._4_4_ << 3,(long)(c._4_4_ + 1) << 3);
      x->x_outvec = pptVar5;
      ptVar6 = (t_out *)getbytes((long)x->x_nout * 0x18);
      x->x_outvec[c._4_4_] = ptVar6;
      for (c._0_4_ = 0; (int)c < x->x_nout; c._0_4_ = (int)c + 1) {
        ptVar6[(int)c].o_pd = clone_out_class;
        iVar2 = obj_issignaloutlet(&x->x_vec->c_gl->gl_obj,c._4_4_);
        ptVar6[(int)c].o_signal = iVar2;
        ptVar6[(int)c].o_n = x->x_startvoice + c._4_4_;
        ptVar6[(int)c].o_outlet = (*x->x_outvec)[(int)c].o_outlet;
        obj_connect(&(x->x_vec[c._4_4_].c_gl)->gl_obj,(int)c,(t_object *)(ptVar6 + (int)c),0);
      }
      x->x_n = x->x_n + 1;
    }
  }
  if (j < iVar1) {
    for (c._4_4_ = j; c._4_4_ < iVar1; c._4_4_ = c._4_4_ + 1) {
      canvas_closebang(x->x_vec[c._4_4_].c_gl);
      pd_free((t_pd *)x->x_vec[c._4_4_].c_gl);
    }
    ptVar4 = (t_copy *)resizebytes(x->x_vec,(long)iVar1 << 4,(long)j << 4);
    x->x_vec = ptVar4;
    x->x_n = j;
  }
LAB_00155514:
  canvas_resume_dsp(oldstate);
  return;
}

Assistant:

void clone_setn(t_clone *x, t_floatarg f)
{
    int dspstate = canvas_suspend_dsp();
    int nwas = x->x_n, wantn = f, i, j;
    if (wantn < 1)
    {
        pd_error(x, "can't resize to zero or negative number; setting to 1");
        wantn = 1;
    }
    if (wantn > nwas)
        for (i = nwas; i < wantn; i++)
    {
        t_canvas *c;
        t_out *outvec;
        SETFLOAT(x->x_argv, x->x_startvoice + i);
        if (!(c = clone_makeone(x->x_s, x->x_argc - x->x_suppressvoice,
            x->x_argv + x->x_suppressvoice)))
        {
            pd_error(x, "clone: couldn't create '%s'", x->x_s->s_name);
            goto done;
        }
        x->x_vec = (t_copy *)t_resizebytes(x->x_vec, i * sizeof(t_copy),
            (i+1) * sizeof(t_copy));
        x->x_vec[i].c_gl = c;
        x->x_vec[i].c_on = 0;
        x->x_outvec = (t_out **)t_resizebytes(x->x_outvec,
            i * sizeof(*x->x_outvec), (i+1) * sizeof(*x->x_outvec));
        x->x_outvec[i] = outvec =
            (t_out *)getbytes(x->x_nout * sizeof(*outvec));
        for (j = 0; j < x->x_nout; j++)
        {
            outvec[j].o_pd = clone_out_class;
            outvec[j].o_signal =
                obj_issignaloutlet(&x->x_vec[0].c_gl->gl_obj, i);
            outvec[j].o_n = x->x_startvoice + i;
            outvec[j].o_outlet =
                x->x_outvec[0][j].o_outlet;
            obj_connect(&x->x_vec[i].c_gl->gl_obj, j,
                (t_object *)(&outvec[j]), 0);
        }
        x->x_n++;
    }
    if (wantn < nwas)
    {
        for (i = wantn; i < nwas; i++)
        {
            canvas_closebang(x->x_vec[i].c_gl);
            pd_free(&x->x_vec[i].c_gl->gl_pd);
        }
        x->x_vec = (t_copy *)t_resizebytes(x->x_vec, nwas * sizeof(t_copy),
            wantn * sizeof(*x->x_vec));
        x->x_n = wantn;
    }
done:
    canvas_resume_dsp(dspstate);
}